

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_wav_read_pcm_frames
                    (ma_wav *pWav,void *pFramesOut,ma_uint64 frameCount,ma_uint64 *pFramesRead)

{
  ma_uint64 mVar1;
  ma_result mVar2;
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  if (pWav == (ma_wav *)0x0 || frameCount == 0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    switch(pWav->format) {
    case ma_format_unknown:
      return MA_INVALID_OPERATION;
    default:
      mVar1 = ma_dr_wav_read_pcm_frames(&pWav->dr,frameCount,pFramesOut);
      break;
    case ma_format_s16:
      mVar1 = ma_dr_wav_read_pcm_frames_s16(&pWav->dr,frameCount,(ma_int16 *)pFramesOut);
      break;
    case ma_format_s32:
      mVar1 = ma_dr_wav_read_pcm_frames_s32(&pWav->dr,frameCount,(ma_int32 *)pFramesOut);
      break;
    case ma_format_f32:
      mVar1 = ma_dr_wav_read_pcm_frames_f32(&pWav->dr,frameCount,(float *)pFramesOut);
    }
    mVar2 = MA_AT_END;
    if (mVar1 != 0) {
      mVar2 = MA_SUCCESS;
    }
    if (pFramesRead != (ma_uint64 *)0x0) {
      *pFramesRead = mVar1;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_wav_read_pcm_frames(ma_wav* pWav, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_WAV)
    {
        /* We always use floating point format. */
        ma_result result = MA_SUCCESS;  /* Must be initialized to MA_SUCCESS. */
        ma_uint64 totalFramesRead = 0;
        ma_format format;

        ma_wav_get_data_format(pWav, &format, NULL, NULL, NULL, 0);

        switch (format)
        {
            case ma_format_f32:
            {
                totalFramesRead = ma_dr_wav_read_pcm_frames_f32(&pWav->dr, frameCount, (float*)pFramesOut);
            } break;

            case ma_format_s16:
            {
                totalFramesRead = ma_dr_wav_read_pcm_frames_s16(&pWav->dr, frameCount, (ma_int16*)pFramesOut);
            } break;

            case ma_format_s32:
            {
                totalFramesRead = ma_dr_wav_read_pcm_frames_s32(&pWav->dr, frameCount, (ma_int32*)pFramesOut);
            } break;

            /* Fallback to a raw read. */
            case ma_format_unknown: return MA_INVALID_OPERATION; /* <-- this should never be hit because initialization would just fall back to a supported format. */
            default:
            {
                totalFramesRead = ma_dr_wav_read_pcm_frames(&pWav->dr, frameCount, pFramesOut);
            } break;
        }

        /* In the future we'll update ma_dr_wav to return MA_AT_END for us. */
        if (totalFramesRead == 0) {
            result = MA_AT_END;
        }

        if (pFramesRead != NULL) {
            *pFramesRead = totalFramesRead;
        }

        if (result == MA_SUCCESS && totalFramesRead == 0) {
            result  = MA_AT_END;
        }

        return result;
    }
    #else
    {
        /* wav is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)pFramesOut;
        (void)frameCount;
        (void)pFramesRead;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}